

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt-base.h
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
mp::pre::ValueMap<std::vector<double,_std::allocator<double>_>,_int>::operator()
          (ValueMap<std::vector<double,_std::allocator<double>_>,_int> *this)

{
  mapped_type *pmVar1;
  _Vector_base<double,_std::allocator<double>_> local_78;
  pair<const_int,_std::vector<double,_std::allocator<double>_>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((this->map_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    local_58.first = 0;
    local_58.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    _Rb_tree<int,std::pair<int_const,std::vector<double,std::allocator<double>>>,std::_Select1st<std::pair<int_const,std::vector<double,std::allocator<double>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<double,std::allocator<double>>>>>
    ::_M_insert_unique<std::pair<int_const,std::vector<double,std::allocator<double>>>>
              ((_Rb_tree<int,std::pair<int_const,std::vector<double,std::allocator<double>>>,std::_Select1st<std::pair<int_const,std::vector<double,std::allocator<double>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<double,std::allocator<double>>>>>
                *)&this->map_,&local_58);
    std::operator+(&local_38,&this->name_,"()");
    std::__cxx11::string::~string((string *)&local_38);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&local_58.second.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_78);
  }
  local_58.first = 0;
  pmVar1 = std::
           map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
           ::at(&this->map_,&local_58.first);
  return pmVar1;
}

Assistant:

Array& operator()() & {
    if (map_.empty())
      SetValueNodeName(
            map_.insert({ 0,
                           CreateArray<Array, Param>(prm_) }).
            first->second,
            name_ + "()");
    else
      assert(IsSingleKey());
    return map_.at(0);
  }